

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void emit(internal_state *state,uint32_t data,int bits)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = state->bits;
  if (iVar3 < bits) {
    puVar1 = state->cds;
    state->cds = puVar1 + 1;
    *puVar1 = *puVar1 + (char)(data >> ((byte)(bits - iVar3) & 0x3f));
    iVar3 = bits - iVar3;
    while (iVar2 = iVar3 + -8, 8 < iVar3) {
      puVar1 = state->cds;
      state->cds = puVar1 + 1;
      *puVar1 = (uint8_t)(data >> ((byte)iVar2 & 0x1f));
      iVar3 = iVar2;
    }
    state->bits = -iVar2;
    *state->cds = (uint8_t)(data << ((byte)-iVar2 & 0x1f));
    return;
  }
  state->bits = iVar3 - bits;
  *state->cds = *state->cds + (char)(data << ((byte)(iVar3 - bits) & 0x1f));
  return;
}

Assistant:

static inline void emit(struct internal_state *state,
                        uint32_t data, int bits)
{
    /**
       Emit sequence of bits.
     */

    if (bits <= state->bits) {
        state->bits -= bits;
        *state->cds += (uint8_t)(data << state->bits);
    } else {
        bits -= state->bits;
        *state->cds++ += (uint8_t)((uint64_t)data >> bits);

        while (bits > 8) {
            bits -= 8;
            *state->cds++ = (uint8_t)(data >> bits);
        }

        state->bits = 8 - bits;
        *state->cds = (uint8_t)(data << state->bits);
    }
}